

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O2

void __thiscall
bloaty::wasm::ReadNames
          (wasm *this,Section *section,IndexedNames *func_names,IndexedNames *dataseg_names,
          RangeSink *sink)

{
  size_t this_00;
  char *pcVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  mapped_type *this_01;
  Section *this_02;
  bool bVar6;
  string_view sVar7;
  string_view section_1;
  string_view name;
  string_view data;
  allocator<char> local_a5;
  uint32_t local_a4;
  string_view local_a0;
  string_view local_90;
  Section *local_80;
  Section *local_78;
  RangeSink *local_70;
  string_view local_68;
  string local_50 [32];
  
  local_68._M_len = *(size_t *)(this + 0x38);
  local_68._M_str = *(char **)(this + 0x40);
  local_80 = section;
  local_78 = (Section *)func_names;
  local_70 = (RangeSink *)dataseg_names;
  while (local_68._M_len != 0) {
    bVar2 = ReadVarUInt7(&local_68);
    uVar3 = ReadVarUInt32(&local_68);
    local_a0 = ReadPiece((ulong)uVar3,&local_68);
    if ((bVar2 | 8) == 9) {
      uVar3 = ReadVarUInt32(&local_a0);
      this_02 = local_78;
      if (bVar2 == 1) {
        this_02 = local_80;
      }
      while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
        this_00 = local_a0._M_len;
        pcVar1 = local_a0._M_str;
        uVar4 = ReadVarUInt32(&local_a0);
        uVar5 = ReadVarUInt32(&local_a0);
        local_90 = ReadPiece((ulong)uVar5,&local_a0);
        sVar7._M_str = (char *)0x0;
        sVar7._M_len = (size_t)pcVar1;
        sVar7 = StrictSubstr((bloaty *)this_00,sVar7,
                             (size_t)(local_90._M_str + (local_90._M_len - (long)pcVar1)),
                             (size_t)sink);
        sink = (RangeSink *)sVar7._M_len;
        RangeSink::AddFileRange(local_70,"wasm_funcname",local_90,sVar7);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (local_50,&local_90,&local_a5);
        local_a4 = uVar4;
        this_01 = std::__detail::
                  _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_02,(key_type *)&local_a4);
        std::__cxx11::string::operator=((string *)this_01,local_50);
        std::__cxx11::string::~string(local_50);
      }
    }
  }
  return;
}

Assistant:

void ReadNames(const Section& section, IndexedNames* func_names,
               IndexedNames* dataseg_names, RangeSink* sink) {
  enum class NameType {
    kModule = 0,
    kFunction = 1,
    kLocal = 2,
    kLabel = 3,
    kType = 4,
    kTable = 5,
    kMemory = 6,
    kGlobal = 7,
    kElemSegment = 8,
    kDataSegment = 9
  };

  string_view data = section.contents;

  while (!data.empty()) {
    NameType type = static_cast<NameType>(ReadVarUInt7(&data));
    uint32_t size = ReadVarUInt32(&data);
    string_view section = ReadPiece(size, &data);

    if (type == NameType::kFunction || type == NameType::kDataSegment) {
      uint32_t count = ReadVarUInt32(&section);
      for (uint32_t i = 0; i < count; i++) {
        string_view entry = section;
        uint32_t index = ReadVarUInt32(&section);
        uint32_t name_len = ReadVarUInt32(&section);
        string_view name = ReadPiece(name_len, &section);
        entry = StrictSubstr(entry, 0, name.data() - entry.data() + name.size());
        sink->AddFileRange("wasm_funcname", name, entry);
        IndexedNames *names = (type == NameType::kFunction ? func_names : dataseg_names);
        (*names)[index] = std::string(name);
      }
    }
  }
}